

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O0

void __thiscall ON_SimpleArray<ON_3dex>::Insert(ON_SimpleArray<ON_3dex> *this,int i,ON_3dex *x)

{
  undefined8 uVar1;
  int iVar2;
  ON_3dex *pOVar3;
  int newcapacity;
  void *temp;
  ON_3dex *p;
  ON_3dex *x_local;
  int i_local;
  ON_SimpleArray<ON_3dex> *this_local;
  
  if ((-1 < i) && (i <= this->m_count)) {
    temp = x;
    if (this->m_count == this->m_capacity) {
      if ((this->m_a <= x) && (x < this->m_a + this->m_capacity)) {
        temp = onmalloc(0xc);
        *(undefined8 *)temp = *(undefined8 *)x;
        *(int *)((long)temp + 8) = x->k;
      }
      iVar2 = NewCapacity(this);
      Reserve(this,(long)iVar2);
    }
    this->m_count = this->m_count + 1;
    Move(this,i + 1,i,(this->m_count + -1) - i);
    pOVar3 = this->m_a + i;
    uVar1 = *temp;
    pOVar3->i = (int)uVar1;
    pOVar3->j = (int)((ulong)uVar1 >> 0x20);
    pOVar3->k = *(int *)((long)temp + 8);
    if ((ON_3dex *)temp != x) {
      onfree(temp);
    }
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Insert( int i, const T& x ) 
{
  if( i >= 0 && i <= m_count ) 
  {
    const T* p = &x;
    if ( m_count == m_capacity ) 
    {
      if (&x >= m_a && &x < (m_a + m_capacity))
      {
        // x is in the block of memory about to be reallocated.
        void* temp = onmalloc(sizeof(T));
        memcpy(temp, p, sizeof(T));
        p = (T*)temp;
      }
      int newcapacity = NewCapacity();
      Reserve( newcapacity );
    }
	  m_count++;
    Move( i+1, i, m_count-1-i );
	  m_a[i] = *p;
    if (p != &x)
      onfree((void*)p);
  }
}